

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O2

int http_client_execute(http_client *client,http_message *response)

{
  tcp_client *client_00;
  ushort uVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  http_message *phVar6;
  long lVar7;
  uint16_t uVar8;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  size_t *psVar13;
  char proto [16];
  http_parser_url local_58;
  http_parser *local_38;
  
  http_message_init(response);
  client->response = response;
  pcVar11 = (client->request->url).p;
  sVar10 = (client->request->url).len;
  http_parser_url_init(&local_58);
  http_parser_parse_url(pcVar11,sVar10,0,&local_58);
  uVar8 = 0x50;
  if (local_58.port != 0) {
    uVar8 = local_58.port;
  }
  client->port = uVar8;
  if (((byte)local_58.field_set & 0x10) != 0) {
    memcpy(client->query_buffer + client->query_buffer_used,pcVar11 + local_58.field_data[4].off,
           (ulong)local_58.field_data[4].len);
    client->query_buffer_used = client->query_buffer_used + (ulong)local_58.field_data[4].len;
  }
  phVar6 = client->request;
  if (phVar6->query->nqueries != 0) {
    sVar10 = client->query_buffer_used;
    sVar2 = uri_query_build(phVar6->query,client->query_buffer + sVar10,0xc80 - sVar10);
    client->query_buffer_used = sVar2 + sVar10;
    phVar6 = client->request;
  }
  uVar1 = phVar6->method;
  pcVar3 = http_method_str((uint)uVar1);
  sVar4 = strlen(pcVar3);
  memcpy((client->request_buffer).p + client->request_buffer_used,pcVar3,sVar4);
  sVar10 = sVar4 + client->request_buffer_used;
  client->request_buffer_used = sVar10;
  (client->request_buffer).p[sVar10] = ' ';
  sVar10 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar10;
  if (((byte)local_58.field_set & 8) != 0) {
    memcpy((client->request_buffer).p + sVar10,pcVar11 + local_58.field_data[3].off,
           (ulong)local_58.field_data[3].len);
    sVar10 = (ulong)local_58.field_data[3].len + client->request_buffer_used;
    client->request_buffer_used = sVar10;
  }
  if (uVar1 == 1) {
    (client->request_buffer).p[sVar10] = '?';
    sVar10 = client->request_buffer_used + 1;
    client->request_buffer_used = sVar10;
    sVar4 = client->query_buffer_used;
    memcpy((client->request_buffer).p + sVar10,client->query_buffer,sVar4);
    sVar10 = sVar4 + client->request_buffer_used;
    client->request_buffer_used = sVar10;
  }
  else {
    client->request->content_length = client->query_buffer_used;
    snprintf(_prepare_resquest_number_text,0x10,"%zd");
    http_message_add_header(client->request,"Content-Length",_prepare_resquest_number_text);
    http_message_add_header(client->request,"Content-Type","application/x-www-form-urlencoded");
    sVar10 = client->request_buffer_used;
  }
  (client->request_buffer).p[sVar10] = ' ';
  sVar10 = client->request_buffer_used + 1;
  client->request_buffer_used = sVar10;
  uVar12 = (ulong)local_58.field_data[0].len;
  for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    pp_Var5 = __ctype_toupper_loc();
    proto[uVar9] = (char)(*pp_Var5)[pcVar11[uVar9 + local_58.field_data[0].off]];
  }
  proto[uVar12] = '/';
  proto[uVar12 + 1] = (byte)(client->http_major % 10) | 0x30;
  proto[uVar12 + 2] = '.';
  proto[uVar12 + 3] = (byte)(client->http_minor % 10) | 0x30;
  memcpy((client->request_buffer).p + sVar10,proto,uVar12 + 4);
  sVar10 = uVar12 + 4 + client->request_buffer_used;
  client->request_buffer_used = sVar10;
  pcVar3 = (client->request_buffer).p + sVar10;
  pcVar3[0] = '\r';
  pcVar3[1] = '\n';
  sVar10 = client->request_buffer_used;
  sVar2 = sVar10 + 2;
  client->request_buffer_used = sVar2;
  if (((byte)local_58.field_set & 2) != 0) {
    builtin_strncpy((client->request_buffer).p + sVar10 + 2,"Host: ",6);
    sVar10 = client->request_buffer_used + 6;
    client->request_buffer_used = sVar10;
    uVar9 = (ulong)local_58.field_data[1].len;
    memcpy((client->request_buffer).p + sVar10,pcVar11 + local_58.field_data[1].off,uVar9);
    client->request_buffer_used = client->request_buffer_used + uVar9;
    memcpy(client->host,pcVar11 + local_58.field_data[1].off,uVar9);
    pcVar11 = (client->request_buffer).p + client->request_buffer_used;
    pcVar11[0] = '\r';
    pcVar11[1] = '\n';
    sVar2 = client->request_buffer_used + 2;
    client->request_buffer_used = sVar2;
  }
  phVar6 = client->request;
  psVar13 = &phVar6->header_values[0].len;
  for (uVar9 = 0; uVar9 < phVar6->nheaders; uVar9 = uVar9 + 1) {
    sVar4 = psVar13[-0x40];
    memcpy((client->request_buffer).p + sVar2,(void *)psVar13[-0x41],sVar4);
    sVar10 = sVar4 + client->request_buffer_used;
    client->request_buffer_used = sVar10;
    pcVar11 = (client->request_buffer).p + sVar10;
    pcVar11[0] = ':';
    pcVar11[1] = ' ';
    sVar10 = client->request_buffer_used + 2;
    client->request_buffer_used = sVar10;
    sVar4 = *psVar13;
    memcpy((client->request_buffer).p + sVar10,((ss *)(psVar13 + -1))->p,sVar4);
    sVar10 = sVar4 + client->request_buffer_used;
    client->request_buffer_used = sVar10;
    pcVar11 = (client->request_buffer).p + sVar10;
    pcVar11[0] = '\r';
    pcVar11[1] = '\n';
    phVar6 = client->request;
    sVar2 = client->request_buffer_used + 2;
    client->request_buffer_used = sVar2;
    psVar13 = psVar13 + 2;
  }
  pcVar11 = (client->request_buffer).p + sVar2;
  pcVar11[0] = '\r';
  pcVar11[1] = '\n';
  sVar10 = client->request_buffer_used + 2;
  client->request_buffer_used = sVar10;
  if ((client->request->method != 1) && (sVar4 = client->query_buffer_used, sVar4 != 0)) {
    memcpy((client->request_buffer).p + sVar10,client->query_buffer,sVar4);
    sVar10 = sVar4 + client->request_buffer_used;
    client->request_buffer_used = sVar10;
    pcVar11 = (client->request_buffer).p + sVar10;
    pcVar11[0] = '\r';
    pcVar11[1] = '\n';
    client->request_buffer_used = client->request_buffer_used + 2;
  }
  client_00 = &client->connector;
  tcp_client_connect(client_00,client->host,client->port);
  sVar10 = client->request_buffer_used;
  pcVar11 = (client->request_buffer).p;
  do {
    lVar7 = tcp_client_send(client_00,pcVar11,sVar10);
    if (lVar7 < 1) break;
    sVar10 = sVar10 - lVar7;
    pcVar11 = pcVar11 + lVar7;
  } while (0 < (long)sVar10);
  local_38 = &client->parser;
  http_parser_init(local_38,HTTP_RESPONSE);
  (client->parser).data = client;
  pcVar11 = (client->response_buffer).p;
  lVar7 = 0;
  do {
    sVar10 = tcp_client_recv(client_00,pcVar11,(client->response_buffer).len - lVar7);
    if ((long)sVar10 < 1) break;
    http_parser_execute(local_38,&client->settings,pcVar11,sVar10);
    lVar7 = lVar7 + sVar10;
    pcVar11 = pcVar11 + sVar10;
  } while (client->response_complete != true);
  tcp_client_close(client_00);
  return 0;
}

Assistant:

int http_client_execute(http_client* client, http_message* response)
{
    ssize_t nbytes = 0, count = 0, remains = 0;
    char* pos;

    http_message_init(response);
    client->response = response;
    _prepare_resquest(client);
    tcp_client_connect(&client->connector, client->host, client->port);

    count = 0;
    pos = (char*)client->request_buffer.p;
    remains = client->request_buffer_used;
    do {
        nbytes = tcp_client_send(&client->connector, pos, remains);
        remains -= nbytes;
        count += nbytes;
        pos += nbytes;
    } while (nbytes > 0 && remains > 0);

    LOGD("sent count: %ld\n", count);

    // parser reset
    http_parser_init(&client->parser, HTTP_RESPONSE);
    client->parser.data = client;

    count = 0;
    pos = (char*)client->response_buffer.p;
    do {
        nbytes = tcp_client_recv(&client->connector, pos,
                                 client->response_buffer.len - count);
        if (nbytes <= 0) break;
        http_parser_execute(&client->parser, &client->settings, pos, nbytes);
        count += nbytes;
        pos += nbytes;
    } while (!client->response_complete);
    LOGD("recv count: %ld\n", count);

    tcp_client_close(&client->connector);
    return 0;
}